

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DGRSubgraphMining.cpp
# Opt level: O2

vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *
dgrminer::find_forward_edge_candidates
          (vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
           *__return_storage_ptr__,
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          *adj_list,
          vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
          *adj_more_info,int src,vector<int,_std::allocator<int>_> *sequence_of_nodes,
          vector<int,_std::allocator<int>_> *real_second_edge_ids)

{
  value_type_conflict *__x;
  int *piVar1;
  pointer pvVar2;
  pointer piVar3;
  long lVar4;
  size_t v;
  ulong uVar5;
  
  (__return_storage_ptr__->
  super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar5 = 0;
  do {
    pvVar2 = (adj_list->
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    lVar4 = *(long *)&pvVar2[src].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data;
    if ((ulong)((long)*(pointer *)
                       ((long)&pvVar2[src].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data + 8) - lVar4 >> 2) <= uVar5) {
      return __return_storage_ptr__;
    }
    piVar3 = (sequence_of_nodes->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    __x = (value_type_conflict *)(lVar4 + uVar5 * 4);
    lVar4 = 0;
    do {
      if ((long)(sequence_of_nodes->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)piVar3 >> 2 == lVar4) {
        std::vector<int,_std::allocator<int>_>::push_back(real_second_edge_ids,__x);
        std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::push_back
                  (__return_storage_ptr__,
                   (value_type *)
                   (uVar5 * 0x20 +
                   *(long *)&(adj_more_info->
                             super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start[src].
                             super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                             ._M_impl.super__Vector_impl_data));
        break;
      }
      piVar1 = piVar3 + lVar4;
      lVar4 = lVar4 + 1;
    } while (*__x != *piVar1);
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

std::vector<std::array<int, 8>> find_forward_edge_candidates(std::vector<std::vector<int>> &adj_list,
		std::vector<std::vector<std::array<int, 8>>> &adj_more_info,
		int src, std::vector<int> &sequence_of_nodes, std::vector<int> &real_second_edge_ids)
	{
		std::vector<std::array<int, 8>> edge_candidates;

		for (size_t v = 0; v < adj_list[src].size(); v++)
		{
			bool is_in_sequence_of_nodes = false;
			for (size_t i = 0; i < sequence_of_nodes.size(); i++)
			{
				if (adj_list[src][v] == sequence_of_nodes[i]) {
					is_in_sequence_of_nodes = true;
					break;
				}
			}
			if (!is_in_sequence_of_nodes) {
			  	real_second_edge_ids.push_back(adj_list[src][v]);
				edge_candidates.push_back(adj_more_info[src][v]);
			}
		}
		return edge_candidates;
	}